

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

void md_free_ref_defs(MD_CTX *ctx)

{
  undefined8 *puVar1;
  long in_RDI;
  MD_REF_DEF *def;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x78); local_c = local_c + 1) {
    puVar1 = (undefined8 *)(*(long *)(in_RDI + 0x70) + (long)local_c * 0x28);
    if ((*(byte *)((long)puVar1 + 0x24) & 1) != 0) {
      free((void *)*puVar1);
    }
    if ((*(byte *)((long)puVar1 + 0x24) >> 1 & 1) != 0) {
      free((void *)puVar1[1]);
    }
  }
  free(*(void **)(in_RDI + 0x70));
  return;
}

Assistant:

static void
md_free_ref_defs(MD_CTX* ctx)
{
    int i;

    for(i = 0; i < ctx->n_ref_defs; i++) {
        MD_REF_DEF* def = &ctx->ref_defs[i];

        if(def->label_needs_free)
            free(def->label);
        if(def->title_needs_free)
            free(def->title);
    }

    free(ctx->ref_defs);
}